

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

ConstPixelBufferAccess *
tcu::getSubregion(ConstPixelBufferAccess *__return_storage_ptr__,ConstPixelBufferAccess *access,
                 int x,int y,int width,int height)

{
  getSubregion(__return_storage_ptr__,access,x,y,0,width,height,1);
  return __return_storage_ptr__;
}

Assistant:

ConstPixelBufferAccess getSubregion (const ConstPixelBufferAccess& access, int x, int y, int width, int height)
{
	return getSubregion(access, x, y, 0, width, height, 1);
}